

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O2

void __thiscall
ONX_ModelTest::Internal_ReadTest
          (ONX_ModelTest *this,ON_BinaryArchive *archive,Type test_type,bool bKeepModels,
          wchar_t *text_log_file_path,ON_TextLog *text_log)

{
  undefined4 *puVar1;
  bool bVar2;
  uint uVar3;
  archive_mode aVar4;
  ON_wString *src;
  ONX_Model *pOVar5;
  char *pcVar6;
  long lVar7;
  undefined7 in_register_00000009;
  ON_Buffer *pOVar8;
  int buffer_index;
  long lVar9;
  long lVar10;
  ON_String read0_description;
  ON_String text_log_3dm_archive_name;
  ONX_ErrorCounter write1_error_counter;
  long local_3c0;
  ON_String read1_description;
  uint temporary_buffer_3dm_version [2];
  ONX_ErrorCounter *local_3a8;
  undefined4 local_39c;
  ONX_ErrorCounter read0_error_counter;
  ON_String write1_description;
  ON__UINT8 aOStack_368 [4];
  ON__UINT8 aOStack_364 [4];
  ON__UINT8 local_360 [8];
  shared_ptr<ONX_Model> model1_sp;
  shared_ptr<ONX_Model> model0_sp;
  ON_Buffer temporary_buffer [2];
  ON_BinaryArchiveBuffer temporary_archive;
  ON_TextLogNull devnull;
  
  this->m_test_type = test_type;
  src = ON_BinaryArchive::ArchiveFullPath(archive);
  ON_wString::operator=(&this->m_source_3dm_file_path,src);
  ON_wString::operator=(&this->m_text_log_3dm_file_path,text_log_file_path);
  uVar3 = ON_BinaryArchive::CurrentArchiveVersion();
  ON_TextLogNull::ON_TextLogNull(&devnull);
  if (text_log == (ON_TextLog *)0x0) {
    text_log = &ON_TextLog::Null;
  }
  Internal_BeginNextTest(this,Read);
  aVar4 = ON_BinaryArchive::Mode(archive);
  if (aVar4 == read3dm) {
    pOVar5 = (ONX_Model *)onmalloc(0xb88);
    ONX_Model::ONX_Model(pOVar5);
    std::__shared_ptr<ONX_Model,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ONX_Model,void>
              ((__shared_ptr<ONX_Model,(__gnu_cxx::_Lock_policy)2> *)&model0_sp,pOVar5);
    if (bKeepModels) {
      std::__shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&this->m_model[0].super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>,
                 &model0_sp.super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>);
    }
    TextLogSource3dmFilePath((ONX_ModelTest *)&temporary_archive);
    ON_String::ON_String(&text_log_3dm_archive_name,(ON_wString *)&temporary_archive);
    ON_wString::~ON_wString((ON_wString *)&temporary_archive);
    bVar2 = ON_String::IsEmpty(&text_log_3dm_archive_name);
    if (bVar2) {
      ON_String::operator=(&text_log_3dm_archive_name,"archive");
    }
    pcVar6 = ON_String::operator_cast_to_char_(&text_log_3dm_archive_name);
    ON_String::FormatToString((char *)&read0_description,"ONX_Model.Read(%s,...)",pcVar6);
    pcVar6 = ON_String::operator_cast_to_char_(&read0_description);
    ON_TextLog::Print(text_log,"Calling %s ...\n",pcVar6);
    ON_TextLog::PushIndent(text_log);
    read0_error_counter.m_failure_count = 0;
    read0_error_counter.m_error_count = 0;
    read0_error_counter.m_warning_count = 0;
    read0_error_counter.m_state_bit_field = 0;
    read0_error_counter.m_opennurbs_library_error_count = 0;
    read0_error_counter.m_opennurbs_library_warning_count = 0;
    ONX_ErrorCounter::ClearLibraryErrorsAndWarnings(&read0_error_counter);
    bVar2 = ONX_Model::Read(pOVar5,archive,text_log);
    ONX_ErrorCounter::AddLibraryErrorsAndWarnings(&read0_error_counter);
    this->m_model_3dm_file_version[0] = pOVar5->m_3dm_file_version;
    ON_TextLog::PopIndent(text_log);
    if (bVar2) {
      pcVar6 = ON_String::operator_cast_to_char_(&read0_description);
      ON_TextLog::Print(text_log,"... %s ",pcVar6);
      if (read0_error_counter.m_error_count + read0_error_counter.m_failure_count +
          read0_error_counter.m_warning_count == 0) {
        ON_TextLog::Print(text_log,"succeeded.");
      }
      else {
        ON_TextLog::Print(text_log,"finished. ");
        ONX_ErrorCounter::Dump(&read0_error_counter,text_log);
      }
      ON_TextLog::PrintNewLine(text_log);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"Source model 3dm file version: %d",
                        (ulong)(uint)pOVar5->m_3dm_file_version);
      ON_TextLog::PrintNewLine(text_log);
      ONX_Model::ContentHash((ON_SHA1_Hash *)&temporary_archive,pOVar5);
      *(int *)(this->m_model_hash[0].m_digest + 0x10) =
           temporary_archive.super_ON_BinaryArchive.m_3dm_v1_material_index;
      *(undefined4 *)this->m_model_hash[0].m_digest =
           temporary_archive.super_ON_BinaryArchive._vptr_ON_BinaryArchive._0_4_;
      *(undefined4 *)(this->m_model_hash[0].m_digest + 4) =
           temporary_archive.super_ON_BinaryArchive._vptr_ON_BinaryArchive._4_4_;
      *(int *)(this->m_model_hash[0].m_digest + 8) =
           temporary_archive.super_ON_BinaryArchive.m_3dm_version;
      *(int *)(this->m_model_hash[0].m_digest + 0xc) =
           temporary_archive.super_ON_BinaryArchive.m_3dm_v1_layer_index;
      ON_TextLog::Print(text_log,"Source model hash: ");
      ON_SHA1_Hash::Dump(this->m_model_hash,text_log);
      ON_TextLog::PrintNewLine(text_log);
      ON_TextLog::PopIndent(text_log);
      if (test_type != Read) {
        Internal_EndCurrentTest(this);
        Internal_BeginNextTest(this,ReadWrite);
        pOVar8 = temporary_buffer;
        ON_Buffer::ON_Buffer(pOVar8);
        local_39c = (undefined4)CONCAT71(in_register_00000009,bKeepModels);
        ON_Buffer::ON_Buffer(temporary_buffer + 1);
        temporary_buffer_3dm_version[0] = uVar3 - 10;
        local_3a8 = this->m_error_counts;
        lVar9 = 0;
        temporary_buffer_3dm_version[1] = uVar3;
        do {
          if (lVar9 == 2) break;
          ON_BinaryArchiveBuffer::ON_BinaryArchiveBuffer(&temporary_archive,write3dm,pOVar8);
          uVar3 = temporary_buffer_3dm_version[lVar9];
          ON_String::FormatToString
                    ((char *)&write1_description,
                     "ONX_Model.Write( temporary_archive version %d, ...)",(ulong)uVar3);
          pcVar6 = ON_String::operator_cast_to_char_(&write1_description);
          ON_TextLog::Print(text_log,"Calling %s ...\n",pcVar6);
          ON_TextLog::PushIndent(text_log);
          write1_error_counter.m_failure_count = 0;
          write1_error_counter.m_error_count = 0;
          write1_error_counter.m_warning_count = 0;
          write1_error_counter.m_state_bit_field = 0;
          write1_error_counter.m_opennurbs_library_error_count = 0;
          write1_error_counter.m_opennurbs_library_warning_count = 0;
          ONX_ErrorCounter::ClearLibraryErrorsAndWarnings(&write1_error_counter);
          bVar2 = ONX_Model::Write(pOVar5,&temporary_archive.super_ON_BinaryArchive,uVar3,text_log);
          ONX_ErrorCounter::AddLibraryErrorsAndWarnings(&write1_error_counter);
          ON_TextLog::PopIndent(text_log);
          if (bVar2) {
            pcVar6 = ON_String::operator_cast_to_char_(&write1_description);
            ON_TextLog::Print(text_log,"... %s ",pcVar6);
            if (write1_error_counter.m_error_count + write1_error_counter.m_failure_count +
                write1_error_counter.m_warning_count == 0) {
              ON_TextLog::Print(text_log,"succeeded.");
            }
            else {
              ON_TextLog::Print(text_log,"finished. ");
              ONX_ErrorCounter::Dump(&write1_error_counter,text_log);
            }
            ON_TextLog::PrintNewLine(text_log);
          }
          else {
            local_3a8[this->m_current_test_index].m_failure_count =
                 local_3a8[this->m_current_test_index].m_failure_count + 1;
            pcVar6 = ON_String::operator_cast_to_char_(&write1_description);
            ON_TextLog::Print(text_log,"%s failed.\n",pcVar6);
          }
          ON_String::~ON_String(&write1_description);
          ON_BinaryArchiveBuffer::~ON_BinaryArchiveBuffer(&temporary_archive);
          lVar9 = lVar9 + 1;
          pOVar8 = pOVar8 + 1;
        } while (bVar2);
        if (test_type != ReadWrite) {
          Internal_EndCurrentTest(this);
          Internal_BeginNextTest(this,ReadWriteRead);
          lVar9 = -2;
          local_3c0 = 0x100;
          pOVar8 = temporary_buffer;
          lVar10 = 0x134;
          do {
            if (lVar9 == 0) break;
            ON_BinaryArchiveBuffer::ON_BinaryArchiveBuffer(&temporary_archive,read3dm,pOVar8);
            ON_String::FormatToString
                      ((char *)&read1_description,
                       "ONX_Model.Read( temporary_archive version %d, ...)",
                       (ulong)*(uint *)((long)&local_3a8 + lVar9 * 4));
            pcVar6 = ON_String::operator_cast_to_char_(&read1_description);
            ON_TextLog::Print(text_log,"Calling %s ...\n",pcVar6);
            ON_TextLog::PushIndent(text_log);
            pOVar5 = (ONX_Model *)onmalloc(0xb88);
            ONX_Model::ONX_Model(pOVar5);
            std::__shared_ptr<ONX_Model,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ONX_Model,void>
                      ((__shared_ptr<ONX_Model,(__gnu_cxx::_Lock_policy)2> *)&model1_sp,pOVar5);
            if ((char)local_39c != '\0') {
              std::__shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2> *)
                         ((long)this->m_model_3dm_file_version + local_3c0 + -0x18),
                         &model1_sp.super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>);
            }
            write1_error_counter.m_failure_count = 0;
            write1_error_counter.m_error_count = 0;
            write1_error_counter.m_warning_count = 0;
            write1_error_counter.m_state_bit_field = 0;
            write1_error_counter.m_opennurbs_library_error_count = 0;
            write1_error_counter.m_opennurbs_library_warning_count = 0;
            ONX_ErrorCounter::ClearLibraryErrorsAndWarnings(&write1_error_counter);
            bVar2 = ONX_Model::Read(pOVar5,&temporary_archive.super_ON_BinaryArchive,text_log);
            ONX_ErrorCounter::AddLibraryErrorsAndWarnings(&write1_error_counter);
            this->m_model_3dm_file_version[lVar9 + 3] = pOVar5->m_3dm_file_version;
            ON_TextLog::PopIndent(text_log);
            if (bVar2) {
              pcVar6 = ON_String::operator_cast_to_char_(&read1_description);
              ON_TextLog::Print(text_log,"... %s ",pcVar6);
              if (write1_error_counter.m_error_count + write1_error_counter.m_failure_count +
                  write1_error_counter.m_warning_count == 0) {
                ON_TextLog::Print(text_log,"succeeded.");
              }
              else {
                ON_TextLog::Print(text_log,"finished. ");
                ONX_ErrorCounter::Dump(&write1_error_counter,text_log);
              }
              ON_TextLog::PrintNewLine(text_log);
              ON_TextLog::PushIndent(text_log);
              ON_TextLog::Print(text_log,"Temporary model %d 3dm file version: %d",
                                lVar9 + 3U & 0xffffffff,(ulong)(uint)pOVar5->m_3dm_file_version);
              ON_TextLog::PrintNewLine(text_log);
              ONX_Model::ContentHash((ON_SHA1_Hash *)&write1_description,pOVar5);
              *(undefined4 *)((long)this->m_model_3dm_file_version + lVar10 + -8) = local_360._0_4_;
              puVar1 = (undefined4 *)((long)this->m_model_3dm_file_version + lVar10 + -0x18);
              *puVar1 = write1_description.m_s._0_4_;
              puVar1[1] = write1_description.m_s._4_4_;
              puVar1[2] = aOStack_368;
              puVar1[3] = aOStack_364;
              ON_TextLog::Print(text_log,"Temporary model %d hash: ",lVar9 + 3U & 0xffffffff);
              ON_SHA1_Hash::Dump((ON_SHA1_Hash *)
                                 ((long)this->m_model_3dm_file_version + lVar10 + -0x18),text_log);
              ON_TextLog::PrintNewLine(text_log);
              ON_TextLog::PopIndent(text_log);
            }
            else {
              local_3a8[this->m_current_test_index].m_failure_count =
                   local_3a8[this->m_current_test_index].m_failure_count + 1;
              pcVar6 = ON_String::operator_cast_to_char_(&read1_description);
              ON_TextLog::Print(text_log,"%s failed.\n",pcVar6);
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&model1_sp.super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            ON_String::~ON_String(&read1_description);
            ON_BinaryArchiveBuffer::~ON_BinaryArchiveBuffer(&temporary_archive);
            lVar9 = lVar9 + 1;
            local_3c0 = local_3c0 + 0x10;
            pOVar8 = pOVar8 + 1;
            lVar10 = lVar10 + 0x14;
          } while (bVar2);
          Internal_EndCurrentTest(this);
          Internal_BeginNextTest(this,ReadWriteReadCompare);
          bVar2 = true;
          lVar9 = 0;
          while( true ) {
            lVar7 = lVar9 * -0x14 + -0x134;
            lVar10 = lVar9;
            while( true ) {
              if (lVar10 == 2) {
                if (bVar2) {
                  this->m_test_results[this->m_current_test_index] = Skip;
                }
                goto LAB_004897dd;
              }
              if ((this->m_model_3dm_file_version[0] == this->m_model_3dm_file_version[lVar10 + 1])
                 && (this->m_model_3dm_file_version[0] == temporary_buffer_3dm_version[lVar10]))
              break;
              lVar7 = lVar7 + -0x14;
              lVar10 = lVar10 + 1;
            }
            bVar2 = ::operator!=(this->m_model_hash,(ON_SHA1_Hash *)((long)this - lVar7));
            if (bVar2) break;
            lVar9 = lVar10 + 1;
            bVar2 = false;
            ON_TextLog::Print(text_log,"The source model and temporary model %d are identical.\n",
                              lVar10 + 1U & 0xffffffff);
          }
          local_3a8[this->m_current_test_index].m_failure_count =
               local_3a8[this->m_current_test_index].m_failure_count + 1;
          ON_TextLog::Print(text_log,"The source model and temporary model %d are different.\n",
                            (ulong)((int)lVar10 + 1));
        }
LAB_004897dd:
        lVar9 = 0x40;
        do {
          ON_Buffer::~ON_Buffer((ON_Buffer *)(temporary_buffer[0].m_reserved + lVar9 + -0x34));
          lVar9 = lVar9 + -0x40;
        } while (lVar9 != -0x40);
      }
    }
    else {
      this->m_error_counts[this->m_current_test_index].m_failure_count =
           this->m_error_counts[this->m_current_test_index].m_failure_count + 1;
      pcVar6 = ON_String::operator_cast_to_char_(&read0_description);
      ON_TextLog::Print(text_log,"%s failed.\n",pcVar6);
    }
    ON_String::~ON_String(&read0_description);
    ON_String::~ON_String(&text_log_3dm_archive_name);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&model0_sp.super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    this->m_error_counts[0].m_failure_count = this->m_error_counts[0].m_failure_count + 1;
    ON_TextLog::Print(text_log,"archive.Mode() must be ON::archive_mode::read3dm.");
  }
  Internal_EndCurrentTest(this);
  ON_TextLog::~ON_TextLog(&devnull.super_ON_TextLog);
  return;
}

Assistant:

void ONX_ModelTest::Internal_ReadTest(
  ON_BinaryArchive& archive,
  ONX_ModelTest::Type test_type,
  bool bKeepModels,
  const wchar_t* text_log_file_path,
  ON_TextLog* text_log
)
{
  m_test_type = test_type;
  m_source_3dm_file_path = archive.ArchiveFullPath();
  m_text_log_3dm_file_path = text_log_file_path;

  const unsigned int current_3dm_file_version = (unsigned int)ON_BinaryArchive::CurrentArchiveVersion();

  ON_TextLogNull devnull;
  if (nullptr == text_log)
    text_log = &ON_TextLog::Null;

  for (;;)
  {
    Internal_BeginNextTest(ONX_ModelTest::Type::Read);

    if ( ON::archive_mode::read3dm != archive.Mode() )
    {
      m_error_counts[0].IncrementFailureCount();
      text_log->Print("archive.Mode() must be ON::archive_mode::read3dm.");
      break;
    }

    ONX_Model* model0 = new ONX_Model();
    std::shared_ptr<ONX_Model> model0_sp = std::shared_ptr<ONX_Model>(model0);
    if (bKeepModels)
      this->m_model[0] = model0_sp;

    ON_String text_log_3dm_archive_name = TextLogSource3dmFilePath();
    if (text_log_3dm_archive_name.IsEmpty())
    {
      text_log_3dm_archive_name = "archive";
    }

    const ON_String read0_description
      = ON_String::FormatToString("ONX_Model.Read(%s,...)", static_cast<const char*>(text_log_3dm_archive_name));

    // read the original file
    text_log->Print("Calling %s ...\n", static_cast<const char*>(read0_description));
    text_log->PushIndent();
    ONX_ErrorCounter read0_error_counter;
    read0_error_counter.ClearLibraryErrorsAndWarnings();
    const bool bRead0 = model0->Read(archive, text_log);
    read0_error_counter.AddLibraryErrorsAndWarnings();
    m_model_3dm_file_version[0] = model0->m_3dm_file_version;

    text_log->PopIndent();

    if (false == bRead0)
    {
      m_error_counts[m_current_test_index].IncrementFailureCount();
      text_log->Print("%s failed.\n", static_cast<const char*>(read0_description));
      break;
    }
    else
    {
      text_log->Print("... %s ", static_cast<const char*>(read0_description));
      if ( 0 == read0_error_counter.TotalCount() )
        text_log->Print("succeeded.");
      else
      {
        text_log->Print("finished. ");
        read0_error_counter.Dump(*text_log);
      }
      text_log->PrintNewLine();

    }
    text_log->PushIndent();
    text_log->Print("Source model 3dm file version: %d", model0->m_3dm_file_version);
    text_log->PrintNewLine();
    m_model_hash[0] = model0->ContentHash();
    text_log->Print("Source model hash: ");
    m_model_hash[0].Dump(*text_log);
    text_log->PrintNewLine();
    text_log->PopIndent();

    if ( ONX_ModelTest::Type::Read == test_type)
      break;
    Internal_EndCurrentTest();
    Internal_BeginNextTest(ONX_ModelTest::Type::ReadWrite);

    //const unsigned int original_model_3dm_file_version = (unsigned int)(model0->m_3dm_file_version);

    // Write original_model to a termporary archive using "buffer" for storage. 
    ON_Buffer temporary_buffer[2];
    const unsigned int temporary_buffer_3dm_version[2] = { current_3dm_file_version - 10, current_3dm_file_version };

    for (int buffer_index = 0; buffer_index < 2; buffer_index++)
    {
      ON_BinaryArchiveBuffer temporary_archive(ON::archive_mode::write3dm, &temporary_buffer[buffer_index]);

      const ON_String write1_description
        = ON_String::FormatToString(
          "ONX_Model.Write( temporary_archive version %d, ...)",
          temporary_buffer_3dm_version[buffer_index]);

      text_log->Print("Calling %s ...\n", static_cast<const char*>(write1_description));
      text_log->PushIndent();
      ONX_ErrorCounter write1_error_counter;
      write1_error_counter.ClearLibraryErrorsAndWarnings();
      bool bWrite1 = model0->Write(temporary_archive, temporary_buffer_3dm_version[buffer_index], text_log);
      write1_error_counter.AddLibraryErrorsAndWarnings();
      text_log->PopIndent();

      if (false == bWrite1)
      {
        m_error_counts[m_current_test_index].IncrementFailureCount();
        text_log->Print("%s failed.\n", static_cast<const char*>(write1_description));
        break;
      }
      else
      {
        text_log->Print("... %s ", static_cast<const char*>(write1_description));
        if ( 0 == write1_error_counter.TotalCount() )
          text_log->Print("succeeded.");
        else
        {
          text_log->Print("finished. ");
          write1_error_counter.Dump(*text_log);
        }
        text_log->PrintNewLine();
      }
    }

    // no longer need model0
    model0 = nullptr;

    if ( ONX_ModelTest::Type::ReadWrite == test_type)
      break;
    Internal_EndCurrentTest();
    Internal_BeginNextTest(ONX_ModelTest::Type::ReadWriteRead);

    // read models from the temporary archives
    for (int buffer_index = 0; buffer_index < 2; buffer_index++)
    {
      ON_BinaryArchiveBuffer temporary_archive(ON::archive_mode::read3dm, &temporary_buffer[buffer_index]);
      const ON_String read1_description
        = ON_String::FormatToString(
          "ONX_Model.Read( temporary_archive version %d, ...)",
          temporary_buffer_3dm_version[buffer_index]);

      text_log->Print("Calling %s ...\n", static_cast<const char*>(read1_description));
      text_log->PushIndent();

      ONX_Model* model1 = new ONX_Model();
      std::shared_ptr<ONX_Model> model1_sp = std::shared_ptr<ONX_Model>(model1);
      if (bKeepModels)
        this->m_model[buffer_index+1] = model1_sp;

      ONX_ErrorCounter read1_error_counter;
      read1_error_counter.ClearLibraryErrorsAndWarnings();
      const bool bRead1 = model1->Read(temporary_archive, text_log);
      read1_error_counter.AddLibraryErrorsAndWarnings();      
      m_model_3dm_file_version[buffer_index + 1] = model1->m_3dm_file_version;

      text_log->PopIndent();

      if (false == bRead1)
      {
        m_error_counts[m_current_test_index].IncrementFailureCount();
        text_log->Print("%s failed.\n", static_cast<const char*>(read1_description));
        break;
      }
      else
      {
        text_log->Print("... %s ", static_cast<const char*>(read1_description));
        if ( 0 == read1_error_counter.TotalCount())
          text_log->Print("succeeded.");
        else
        {
          text_log->Print("finished. ");
          read1_error_counter.Dump(*text_log);
        }
        text_log->PrintNewLine();
      }
      text_log->PushIndent();
      text_log->Print("Temporary model %d 3dm file version: %d",buffer_index+1,model1->m_3dm_file_version);
      text_log->PrintNewLine();
      m_model_hash[buffer_index+1] = model1->ContentHash();
      text_log->Print("Temporary model %d hash: ",buffer_index+1);
      m_model_hash[buffer_index+1].Dump(*text_log);
      text_log->PrintNewLine();
      text_log->PopIndent();
    }

    if ( ONX_ModelTest::Type::ReadWrite == test_type)
      break;
    Internal_EndCurrentTest();
    Internal_BeginNextTest(ONX_ModelTest::Type::ReadWriteReadCompare);

    bool bSkippedCompare = true;
    for (int buffer_index = 0; buffer_index < 2; buffer_index++)
    {
      if (m_model_3dm_file_version[0] != m_model_3dm_file_version[buffer_index+1])
        continue;
      if (m_model_3dm_file_version[0] != temporary_buffer_3dm_version[buffer_index])
        continue;

      bSkippedCompare = false;
      if (m_model_hash[0] != m_model_hash[buffer_index+1])
      {
        m_error_counts[m_current_test_index].IncrementFailureCount();
        text_log->Print("The source model and temporary model %d are different.\n",buffer_index+1);
        break;
      }
      else
      {
        text_log->Print("The source model and temporary model %d are identical.\n",buffer_index+1);
      }
    }

    unsigned int compare_test_index = m_current_test_index;
    if (bSkippedCompare)
      this->m_test_results[compare_test_index] = ONX_ModelTest::Result::Skip;
            
    break;
  }

  Internal_EndCurrentTest();
}